

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.cxx
# Opt level: O0

ptr<srv_config> nuraft::srv_config::deserialize(buffer_serializer *bs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ptr<srv_config> pVar1;
  int32 priority;
  byte is_learner;
  string aux;
  string endpoint;
  char *aux_char;
  char *endpoint_char;
  int32 dc_id;
  int32 id;
  uchar *in_stack_ffffffffffffff48;
  buffer_serializer *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  buffer_serializer *in_stack_ffffffffffffff60;
  element_type *this;
  allocator<char> local_81;
  int *in_stack_ffffffffffffff80;
  undefined1 local_49 [33];
  uchar *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  int32_t local_18;
  int32_t local_14;
  
  this = in_RDI;
  local_14 = buffer_serializer::get_i32((buffer_serializer *)in_RDI);
  local_18 = buffer_serializer::get_i32((buffer_serializer *)this);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             buffer_serializer::get_cstr(in_stack_ffffffffffffff50);
  local_28 = (uchar *)buffer_serializer::get_cstr(in_stack_ffffffffffffff50);
  if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::string::string((string *)(local_49 + 1));
  }
  else {
    in_stack_ffffffffffffff60 = (buffer_serializer *)local_49;
    in_stack_ffffffffffffff58 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_49 + 1),(char *)in_stack_ffffffffffffff58,
               (allocator *)in_stack_ffffffffffffff60);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  if (local_28 == (uchar *)0x0) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff80);
  }
  else {
    in_stack_ffffffffffffff50 = (buffer_serializer *)&local_81;
    in_stack_ffffffffffffff48 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff80,(char *)in_stack_ffffffffffffff48,
               (allocator *)in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(&local_81);
  }
  buffer_serializer::get_u8(in_stack_ffffffffffffff60);
  buffer_serializer::get_i32((buffer_serializer *)this);
  cs_new<nuraft::srv_config,int&,int&,std::__cxx11::string&,std::__cxx11::string&,unsigned_char&,int&>
            (&in_RDI->id_,(int *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  pVar1.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<srv_config>)pVar1.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<srv_config> srv_config::deserialize(buffer_serializer& bs) {
    int32 id = bs.get_i32();
    int32 dc_id = bs.get_i32();
    const char* endpoint_char = bs.get_cstr();
    const char* aux_char = bs.get_cstr();
    std::string endpoint( (endpoint_char) ? endpoint_char : std::string() );
    std::string aux( (aux_char) ? aux_char : std::string() );
    byte is_learner = bs.get_u8();
    int32 priority = bs.get_i32();
    return cs_new<srv_config>(id, dc_id, endpoint, aux, is_learner, priority);
}